

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::ToTypeSpec(GlobOpt *this,BVSparse<Memory::JitArenaAllocator> *bv,BasicBlock *block,
                   IRType toType,BailOutKind bailOutKind,bool lossy,Instr *insertBeforeInstr)

{
  Type TVar1;
  code *pcVar2;
  BOOLEAN BVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  StackSym *this_00;
  RegOpnd *opnd;
  IRType type;
  SymID id;
  ulong uVar7;
  Type_conflict pBVar8;
  ulong uVar9;
  
  pBVar8 = bv->head;
  if (pBVar8 != (Type_conflict)0x0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      uVar9 = (pBVar8->data).word;
      if (uVar9 != 0) {
        TVar1 = pBVar8->startIndex;
        uVar7 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        do {
          id = TVar1 + (BVIndex)uVar7;
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar7);
          this_00 = SymTable::FindStackSym(this->func->m_symTable,id);
          if (((block->globOptData).argObjSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
             (BVar5 = GlobOptBlockData::IsArgumentsSymID(&block->globOptData,id), BVar5 != 0)) {
            CannotAllocateArgumentsObjectOnStack(this,(Func *)0x0);
          }
          BVar3 = BVSparse<Memory::JitArenaAllocator>::Test((block->globOptData).liveVarSyms,id);
          type = TyVar;
          if (BVar3 == '\0') {
            BVar3 = BVSparse<Memory::JitArenaAllocator>::Test((block->globOptData).liveInt32Syms,id)
            ;
            if ((BVar3 == '\0') ||
               (BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                                  ((block->globOptData).liveLossyInt32Syms,id), BVar3 != '\0')) {
              BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                                ((block->globOptData).liveFloat64Syms,id);
              if (BVar3 == '\0') {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar6 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                   ,0x3a2,"((0))","UNREACHED");
                if (!bVar4) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                *puVar6 = 0;
                type = TyIllegal;
              }
              else {
                this_00 = StackSym::GetFloat64EquivSym(this_00,this->func);
                type = TyFloat64;
              }
            }
            else {
              this_00 = StackSym::GetInt32EquivSym(this_00,this->func);
              type = TyInt32;
            }
          }
          uVar9 = uVar9 & ~(1L << (uVar7 & 0x3f));
          opnd = IR::RegOpnd::New(this_00,type,this->func);
          ToTypeSpecUse(this,(Instr *)0x0,&opnd->super_Opnd,block,(Value *)0x0,(IndirOpnd *)0x0,
                        toType,bailOutKind,lossy,insertBeforeInstr);
          uVar7 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
        } while (uVar9 != 0);
      }
      pBVar8 = pBVar8->next;
    } while (pBVar8 != (Type)0x0);
  }
  return;
}

Assistant:

void
GlobOpt::ToTypeSpec(BVSparse<JitArenaAllocator> *bv, BasicBlock *block, IRType toType, IR::BailOutKind bailOutKind, bool lossy, IR::Instr *insertBeforeInstr)
{
    FOREACH_BITSET_IN_SPARSEBV(id, bv)
    {
        StackSym *stackSym = this->func->m_symTable->FindStackSym(id);
        IRType fromType = TyIllegal;

        // Win8 bug: 757126. If we are trying to type specialize the arguments object,
        // let's make sure stack args optimization is not enabled. This is a problem, particularly,
        // if the instruction comes from an unreachable block. In other cases, the pass on the
        // instruction itself should disable arguments object optimization.
        if(block->globOptData.argObjSyms && block->globOptData.IsArgumentsSymID(id))
        {
            CannotAllocateArgumentsObjectOnStack(nullptr);
        }

        if (block->globOptData.liveVarSyms->Test(id))
        {
            fromType = TyVar;
        }
        else if (block->globOptData.liveInt32Syms->Test(id) && !block->globOptData.liveLossyInt32Syms->Test(id))
        {
            fromType = TyInt32;
            stackSym = stackSym->GetInt32EquivSym(this->func);
        }
        else if (block->globOptData.liveFloat64Syms->Test(id))
        {

            fromType = TyFloat64;
            stackSym = stackSym->GetFloat64EquivSym(this->func);
        }
        else
        {
            Assert(UNREACHED);
        }

        IR::RegOpnd *newOpnd = IR::RegOpnd::New(stackSym, fromType, this->func);

        this->ToTypeSpecUse(nullptr, newOpnd, block, nullptr, nullptr, toType, bailOutKind, lossy, insertBeforeInstr);
    } NEXT_BITSET_IN_SPARSEBV;
}